

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<DeclareStatementAstNode>_> * __thiscall
Parser::parseDeclareStatement
          (optional<std::shared_ptr<DeclareStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  bool *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  TokenType type;
  undefined1 local_b8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_98 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  element_type *local_78;
  shared_ptr<Token> identifier;
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [3];
  allocator<char> local_2a;
  byte local_29;
  bool error;
  
  local_29 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected a var",
             (allocator<char> *)
             &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this_00 = &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
             super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged;
  type = (TokenType)this;
  expect((Parser *)local_b8,type,(bool *)0x11,(string *)&local_29);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected whitespace following var declaration",
             (allocator<char> *)
             &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  expect((Parser *)(local_b8 + 0x10),type,(bool *)0x4,(string *)&local_29);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__cxx11::string::~string((string *)this_00);
  skipWhiteSpace(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected an identifier following var declaration",
             (allocator<char> *)
             &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  expect((Parser *)&stack0xffffffffffffff88,type,(bool *)0x18,(string *)&local_29);
  std::__cxx11::string::~string((string *)this_00);
  skipWhiteSpace(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected an equals following var declaration",
             (allocator<char> *)
             &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  expect((Parser *)local_98,type,(bool *)0x12,(string *)&local_29);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  std::__cxx11::string::~string((string *)this_00);
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)
                  &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this
                 );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected a semicolon following expression of var declaration",&local_2a);
  expect((Parser *)(local_98 + 0x10),type,(bool *)0x10,(string *)&local_29);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::__cxx11::string::~string
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
  if (((local_29 == 0) && (local_78 != (element_type *)0x0)) &&
     (local_29 = expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_
                 ^ 1,
     expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
     super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
     super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ != '\0')) {
    std::
    make_shared<DeclareStatementAstNode,std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
              ((shared_ptr<Token> *)
               &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
               (shared_ptr<ExpressionAstNode> *)&stack0xffffffffffffff88);
    _Var1._M_pi = local_48[0]._M_pi;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<DeclareStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<DeclareStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<DeclareStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<DeclareStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_;
    local_48[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<DeclareStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<DeclareStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<DeclareStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<DeclareStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var1._M_pi;
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._17_7_ = 0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<DeclareStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<DeclareStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<DeclareStatementAstNode>_>._M_engaged = true;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<DeclareStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<DeclareStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<DeclareStatementAstNode>_>._M_engaged = false;
  }
  std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_reset
            ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)
             &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<DeclareStatementAstNode>>
Parser::parseDeclareStatement() noexcept {
  bool error = false;

  this->expect(TokenType::Var, error, "Expected a var");

  this->expect(TokenType::WhiteSpace, error, "Expected whitespace following var declaration");

  this->skipWhiteSpace();

  auto identifier = this->expect(TokenType::Identifier, error,
    "Expected an identifier following var declaration");

  this->skipWhiteSpace();

  this->expect(TokenType::Assign, error, "Expected an equals following var declaration");

  auto expression = this->parseExpression();

  this->expect(TokenType::SemiColon, error,
    "Expected a semicolon following expression of var declaration");

  error = error || !identifier || !expression;

  if (error) { return std::nullopt; }

  return std::make_shared<DeclareStatementAstNode>(identifier, expression.value());
}